

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

ostream * FIX::operator<<(ostream *stream,SessionSettings *sessionSettings)

{
  bool bVar1;
  Dictionary *this;
  size_t sVar2;
  ostream *poVar3;
  reference ppVar4;
  reference sessionID_00;
  Dictionary *this_00;
  __type_conflict1 local_11a;
  string local_e8;
  reference local_c8;
  value_type *sectionParam;
  iterator __end2_1;
  iterator __begin2_1;
  Dictionary *__range2_1;
  Dictionary *section;
  SessionID *sessionID;
  iterator __end1;
  iterator __begin1;
  set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *__range1;
  value_type *defaultParam;
  iterator __end2;
  iterator __begin2;
  Dictionary *__range2;
  Dictionary *defaults;
  SessionSettings *sessionSettings_local;
  ostream *stream_local;
  
  this = SessionSettings::get(sessionSettings);
  sVar2 = Dictionary::size(this);
  if (sVar2 != 0) {
    poVar3 = std::operator<<(stream,"[DEFAULT]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    __end2 = Dictionary::begin_abi_cxx11_(this);
    defaultParam = (value_type *)Dictionary::end_abi_cxx11_(this);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&defaultParam), bVar1) {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(&__end2);
      poVar3 = std::operator<<(stream,(string *)ppVar4);
      poVar3 = std::operator<<(poVar3,"=");
      poVar3 = std::operator<<(poVar3,(string *)&ppVar4->second);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end2);
    }
    std::ostream::operator<<(stream,std::endl<char,std::char_traits<char>>);
  }
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin1,sessionSettings);
  __end1 = std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
           begin((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 &__begin1);
  sessionID = (SessionID *)
              std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::
              end((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )&__begin1);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&sessionID), bVar1) {
    sessionID_00 = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&__end1);
    poVar3 = std::operator<<(stream,"[SESSION]");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_00 = SessionSettings::get(sessionSettings,sessionID_00);
    sVar2 = Dictionary::size(this_00);
    if (sVar2 != 0) {
      __end2_1 = Dictionary::begin_abi_cxx11_(this_00);
      sectionParam = (value_type *)Dictionary::end_abi_cxx11_(this_00);
      while (bVar1 = std::operator!=(&__end2_1,(_Self *)&sectionParam), bVar1) {
        local_c8 = std::
                   _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&__end2_1);
        bVar1 = Dictionary::has(this,&local_c8->first);
        local_11a = false;
        if (bVar1) {
          Dictionary::getString(&local_e8,this,&local_c8->first,false);
          local_11a = std::operator==(&local_e8,&local_c8->second);
          std::__cxx11::string::~string((string *)&local_e8);
        }
        if (local_11a == false) {
          poVar3 = std::operator<<(stream,(string *)local_c8);
          poVar3 = std::operator<<(poVar3,"=");
          poVar3 = std::operator<<(poVar3,(string *)&local_c8->second);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        std::
        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator++(&__end2_1);
      }
      std::ostream::operator<<(stream,std::endl<char,std::char_traits<char>>);
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&__end1);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &__begin1);
  return stream;
}

Assistant:

std::ostream &operator<<(std::ostream &stream, const SessionSettings &sessionSettings) {
  const Dictionary &defaults = sessionSettings.get();
  if (defaults.size()) {
    stream << "[DEFAULT]" << std::endl;
    for (const Dictionary::value_type &defaultParam : defaults) {
      stream << defaultParam.first << "=" << defaultParam.second << std::endl;
    }
    stream << std::endl;
  }

  for (const SessionID &sessionID : sessionSettings.getSessions()) {
    stream << "[SESSION]" << std::endl;
    const Dictionary &section = sessionSettings.get(sessionID);
    if (!section.size()) {
      continue;
    }

    for (const Dictionary::value_type &sectionParam : section) {
      if (defaults.has(sectionParam.first) && defaults.getString(sectionParam.first) == sectionParam.second) {
        continue;
      }
      stream << sectionParam.first << "=" << sectionParam.second << std::endl;
    }
    stream << std::endl;
  }

  return stream;
}